

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.c
# Opt level: O1

stumpless_element * unchecked_load_element(stumpless_element *element,char *name,size_t name_length)

{
  config_mutex_t *pcVar1;
  
  element->name_length = name_length;
  memcpy(element,name,name_length);
  element->name[name_length] = '\0';
  element->params = (stumpless_param **)0x0;
  element->param_count = 0;
  pcVar1 = thread_safety_new_mutex();
  element->mutex = pcVar1;
  if (pcVar1 != (config_mutex_t *)0x0) {
    pcVar1 = (config_mutex_t *)element;
  }
  return (stumpless_element *)pcVar1;
}

Assistant:

struct stumpless_element *
unchecked_load_element( struct stumpless_element *element,
                        const char *name,
                        size_t name_length ) {
  element->name_length = name_length;
  memcpy( element->name, name, name_length );
  element->name[name_length] = '\0';

  element->params = NULL;
  element->param_count = 0;

  config_assign_cached_mutex( element->mutex );
  if( !config_check_mutex_valid( element->mutex ) ) {
    return NULL;
  }

  config_init_journald_element( element );

  return element;
}